

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  bool bVar1;
  uint3 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *pfVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  KeyValue<char,_char> middleElem;
  KeyValue<char,_char> firstLeqElem;
  KeyValue<char,_char> local_3c;
  KeyValue<char,_char> local_3a;
  char *local_38;
  
  pfVar6 = equal;
  local_38 = pattern;
  iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage[1]
          )();
  uVar5 = (uint)pfVar6;
  if ((char)iVar3 != '\0') {
    uVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage
              [1])(this);
    iVar3 = 0;
    cVar7 = '\0';
    if ('\x01' < (char)uVar4) {
      uVar5 = uVar4 & 0xff;
      uVar9 = 0;
      do {
        uVar5 = (int)(iVar3 + uVar5) / 2;
        iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>)
                  .super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                  _vptr_OrderedStorage[4])(this,(ulong)(uint)(int)(char)uVar5);
        local_3c = SUB42(iVar3,0);
        if ((less->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0014135d;
        bVar1 = (*less->_M_invoker)((_Any_data *)less,&local_3c,local_38);
        uVar8 = uVar5;
        if (!bVar1) {
          if ((equal->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0014135d;
          bVar1 = (*equal->_M_invoker)((_Any_data *)equal,&local_3c,local_38);
          uVar4 = uVar4 & 0xff;
          if (!bVar1) {
            uVar4 = uVar5 & 0xff;
          }
          uVar8 = uVar9 & 0xff;
          if (bVar1) {
            uVar8 = uVar5 & 0xff;
          }
        }
        uVar5 = (uint)(char)uVar4;
        cVar7 = (char)uVar8;
        iVar3 = (int)cVar7;
        uVar9 = uVar8;
      } while (1 < (int)(uVar5 - iVar3));
    }
    iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage
              [1])(this);
    if (cVar7 < (char)iVar3) {
      iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                _vptr_OrderedStorage[4])(this,(ulong)(uint)(int)cVar7);
      local_3a = SUB42(iVar3,0);
      if ((equal->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0014135d:
        std::__throw_bad_function_call();
      }
      bVar1 = (*equal->_M_invoker)((_Any_data *)equal,&local_3a,local_38);
      uVar2 = (uint3)bVar1;
      uVar5 = (uint)(ushort)local_3a;
      goto LAB_00141343;
    }
  }
  uVar2 = 0;
LAB_00141343:
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         ((uint3)uVar5 & 0xffff | uVar2 << 0x10);
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }